

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

LinTerms * __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::SplitLinTerms(Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,LinTerms *ltin,LinTerms *lt_out_vars)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  long in_RSI;
  LinTerms *in_RDI;
  double dVar5;
  size_t i;
  double c;
  int v;
  int v_1;
  int *__end2;
  int *__begin2;
  ArrayRef<int> *__range2;
  int nvars;
  LinTerms *result;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff20;
  LinTerms *in_stack_ffffffffffffff28;
  ulong local_90;
  int *local_60;
  undefined1 local_58 [40];
  undefined1 *local_30;
  int local_28;
  undefined1 local_21;
  
  local_21 = 0;
  LinTerms::LinTerms((LinTerms *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_28 = 0;
  LinTerms::vars(in_stack_ffffffffffffff28);
  local_30 = local_58;
  local_60 = ArrayRef<int>::begin((ArrayRef<int> *)0x48167d);
  piVar3 = ArrayRef<int>::end((ArrayRef<int> *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  for (; local_60 != piVar3; local_60 = local_60 + 1) {
    bVar1 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      ((FlatModel<mp::DefaultFlatModelParams> *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff0c);
    if (bVar1) {
      local_28 = local_28 + 1;
    }
  }
  ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x4816d1);
  LinTerms::reserve((LinTerms *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  LinTerms::size((LinTerms *)0x48177f);
  LinTerms::reserve((LinTerms *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  for (local_90 = 0; sVar4 = LinTerms::size((LinTerms *)0x4817ca), local_90 < sVar4;
      local_90 = local_90 + 1) {
    dVar5 = LinTerms::coef((LinTerms *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                           ,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      dVar5 = (double)(in_RSI + -0x208);
      iVar2 = LinTerms::var((LinTerms *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      bVar1 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                        ((FlatModel<mp::DefaultFlatModelParams> *)
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         in_stack_ffffffffffffff0c);
      in_stack_ffffffffffffff14 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff14);
      if (bVar1) {
        LinTerms::add_term((LinTerms *)CONCAT44(iVar2,in_stack_ffffffffffffff20),dVar5,
                           in_stack_ffffffffffffff14);
      }
      else {
        LinTerms::add_term((LinTerms *)CONCAT44(iVar2,in_stack_ffffffffffffff20),dVar5,
                           in_stack_ffffffffffffff14);
      }
    }
  }
  return in_RDI;
}

Assistant:

LinTerms SplitLinTerms(const LinTerms& ltin, LinTerms& lt_out_vars) {
    LinTerms result;
    int nvars=0;
    for (int v: ltin.vars())
      if (MPCD( IsProperVar(v) ))
        ++nvars;
    lt_out_vars.reserve(nvars);
    result.reserve(ltin.size() - nvars);
    int v=0;
    double c=0.0;
    for (size_t i=0; i<ltin.size(); ++i) {
      if ((c = ltin.coef(i))) {                       // non-0
        if (MPCD( IsProperVar(v = ltin.var(i)) )) {
          lt_out_vars.add_term(c, v);
        } else {
          result.add_term(c, v);
        }
      }
    }
    return result;
  }